

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngunknown.c
# Opt level: O1

int check(FILE *fp,int argc,char **argv,png_uint_32p flags,display *d,int set_callback)

{
  char *__s1;
  int *__s;
  bool bVar1;
  png_uint_32 *ppVar2;
  char cVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  png_uint_32 pVar8;
  png_structp ppVar9;
  png_infop ppVar10;
  char *pcVar11;
  byte bVar12;
  anon_struct_32_7_46fe1f00 *paVar13;
  int after_IDAT;
  int after_IDAT_00;
  long lVar14;
  uint uVar15;
  uint uVar16;
  png_uint_32 y;
  ulong uVar17;
  png_byte name [5];
  uint local_50;
  undefined4 local_48;
  char local_44;
  png_uint_32 *local_40;
  ulong local_38;
  
  d->keep = 0;
  d->before_IDAT = 0;
  d->after_IDAT = 0;
  ppVar9 = (png_structp)png_create_read_struct("1.6.48.git",d,error,warning);
  d->png_ptr = ppVar9;
  if (ppVar9 == (png_structp)0x0) {
LAB_00102ef9:
    check_cold_5();
  }
  else {
    ppVar10 = (png_infop)png_create_info_struct(ppVar9);
    d->info_ptr = ppVar10;
    ppVar10 = (png_infop)png_create_info_struct(d->png_ptr);
    d->end_ptr = ppVar10;
    if ((d->info_ptr != (png_infop)0x0) && (ppVar10 != (png_infop)0x0)) {
      local_40 = flags;
      png_init_io(d->png_ptr,fp);
      if (set_callback != 0) {
        png_set_read_user_chunk_fn(d->png_ptr,d,read_callback);
      }
      if (0 < argc) {
        uVar17 = 0;
        local_38 = (ulong)(uint)argc;
        do {
          __s = (int *)argv[uVar17];
          pcVar11 = strchr((char *)__s,0x3d);
          if (pcVar11 == (char *)0x0) goto LAB_00102ee3;
          __s1 = pcVar11 + 1;
          iVar4 = strcmp(__s1,"default");
          if (iVar4 != 0) {
            iVar4 = strcmp(__s1,"discard");
            if (iVar4 == 0) {
              iVar4 = 1;
              goto LAB_00102bbe;
            }
            iVar4 = strcmp(__s1,"if-safe");
            if (iVar4 == 0) {
              iVar4 = 2;
              goto LAB_00102bbe;
            }
            iVar5 = strcmp(__s1,"save");
            iVar4 = 3;
            if (iVar5 == 0) goto LAB_00102bbe;
LAB_00102eee:
            check_cold_1();
            goto LAB_00102ef9;
          }
          iVar4 = 0;
LAB_00102bbe:
          lVar14 = (long)pcVar11 - (long)__s;
          if (lVar14 != 3) {
            if (lVar14 == 7) {
              if (*(int *)((long)__s + 3) == 0x746c7561 && *__s == 0x61666564) {
                png_set_keep_unknown_chunks(d->png_ptr,iVar4,0,0);
                d->keep = iVar4;
                goto LAB_00102cdc;
              }
            }
            else if (lVar14 == 4) {
              lVar14 = -0x19;
              paVar13 = chunk_info + 0x18;
              do {
                if (lVar14 == 0) {
                  uVar6 = 0xffffffff;
                  goto LAB_00102c9d;
                }
                pcVar11 = paVar13->name;
                lVar14 = lVar14 + 1;
                paVar13 = paVar13 + -1;
              } while (*(int *)pcVar11 != *__s);
              uVar6 = -(int)lVar14;
LAB_00102c9d:
              if (-1 < (int)uVar6) {
                local_44 = chunk_info[uVar6].name[4];
                local_48 = *(undefined4 *)chunk_info[uVar6].name;
                png_set_keep_unknown_chunks(d->png_ptr,iVar4,&local_48,1);
                chunk_info[uVar6].keep = iVar4;
                goto LAB_00102cdc;
              }
            }
LAB_00102ee3:
            check_cold_3();
            goto LAB_00102eee;
          }
          if (*(char *)((long)__s + 2) != 'l' || (short)*__s != 0x6c61) goto LAB_00102ee3;
          png_set_keep_unknown_chunks(d->png_ptr,iVar4,0,0xffffffff);
          d->keep = iVar4;
          lVar14 = 0x1c;
          do {
            if (*(int *)((long)standard_tests + lVar14 + 0xe8) != 0) {
              *(int *)(chunk_info[0].name + lVar14) = iVar4;
            }
            lVar14 = lVar14 + 0x20;
          } while (lVar14 != 0x33c);
LAB_00102cdc:
          uVar17 = uVar17 + 1;
        } while (uVar17 != local_38);
      }
      png_read_info(d->png_ptr,d->info_ptr);
      cVar3 = png_get_interlace_type(d->png_ptr,d->info_ptr);
      if (cVar3 == '\0') {
        local_50 = 1;
        bVar1 = false;
LAB_00102d38:
        if (chunk_info[0].keep == 0) {
          png_start_read_image(d->png_ptr);
          uVar6 = png_get_image_height(d->png_ptr,d->info_ptr);
          if (bVar1) {
            iVar4 = png_get_image_width(d->png_ptr,d->info_ptr);
            uVar16 = 0;
            do {
              uVar7 = 7 - uVar16;
              bVar12 = (byte)(uVar7 >> 1);
              if (uVar16 < 2) {
                bVar12 = 3;
              }
              uVar15 = uVar16 & 1;
              uVar16 = uVar16 + 1;
              if ((~(-1 << (bVar12 & 0x1f)) + iVar4) -
                  (uVar15 << (3U - (char)(uVar16 >> 1) & 0x1f) & 7) >> (bVar12 & 0x1f) != 0 &&
                  uVar6 != 0) {
                bVar12 = (char)uVar7 * '\x04';
                uVar7 = 0;
                do {
                  if (((0x1145af0U >> (bVar12 & 0x1f) & 0xf0 | 0x110145afU >> (bVar12 & 0x1f) & 0xf)
                       >> (uVar7 & 7) & 1) != 0) {
                    png_read_row(d->png_ptr,0,0);
                  }
                  uVar7 = uVar7 + 1;
                } while (uVar6 != uVar7);
              }
            } while (uVar16 != local_50);
          }
          else {
            for (; uVar6 != 0; uVar6 = uVar6 - 1) {
              png_read_row(d->png_ptr,0,0);
            }
          }
        }
        png_read_end(d->png_ptr,d->end_ptr);
        pVar8 = get_valid(d,d->info_ptr);
        ppVar2 = local_40;
        *local_40 = pVar8;
        pVar8 = get_unknown(d,d->info_ptr,after_IDAT);
        ppVar2[1] = pVar8;
        ppVar2[chunk_info[0].keep != 0] = ppVar2[chunk_info[0].keep != 0] | 0x8000;
        pVar8 = get_valid(d,d->end_ptr);
        ppVar2[2] = pVar8;
        pVar8 = get_unknown(d,d->end_ptr,after_IDAT_00);
        ppVar2[3] = pVar8;
        clean_display(d);
        return d->keep;
      }
      if (cVar3 == '\x01') {
        local_50 = 7;
        bVar1 = true;
        goto LAB_00102d38;
      }
      goto LAB_00102f09;
    }
  }
  check_cold_4();
LAB_00102f09:
  check_cold_2();
}

Assistant:

static int
check(FILE *fp, int argc, const char **argv, png_uint_32p flags/*out*/,
   display *d, int set_callback)
{
   int i, npasses, ipass;
   png_uint_32 height;

   d->keep = PNG_HANDLE_CHUNK_AS_DEFAULT;
   d->before_IDAT = 0;
   d->after_IDAT = 0;

   /* Some of these errors are permanently fatal and cause an exit here, others
    * are per-test and cause an error return.
    */
   d->png_ptr = png_create_read_struct(PNG_LIBPNG_VER_STRING, d, error,
      warning);
   if (d->png_ptr == NULL)
   {
      fprintf(stderr, "%s(%s): could not allocate png struct\n", d->file,
         d->test);
      /* Terminate here, this error is not test specific. */
      exit(1);
   }

   d->info_ptr = png_create_info_struct(d->png_ptr);
   d->end_ptr = png_create_info_struct(d->png_ptr);
   if (d->info_ptr == NULL || d->end_ptr == NULL)
   {
      fprintf(stderr, "%s(%s): could not allocate png info\n", d->file,
         d->test);
      clean_display(d);
      exit(1);
   }

   png_init_io(d->png_ptr, fp);

#  ifdef PNG_READ_USER_CHUNKS_SUPPORTED
      /* This is only done if requested by the caller; it interferes with the
       * standard store/save mechanism.
       */
      if (set_callback)
         png_set_read_user_chunk_fn(d->png_ptr, d, read_callback);
#  else
      UNUSED(set_callback)
#  endif

   /* Handle each argument in turn; multiple settings are possible for the same
    * chunk and multiple calls will occur (the last one should override all
    * preceding ones).
    */
   for (i=0; i<argc; ++i)
   {
      const char *equals = strchr(argv[i], '=');

      if (equals != NULL)
      {
         int chunk, option;

         if (strcmp(equals+1, "default") == 0)
            option = PNG_HANDLE_CHUNK_AS_DEFAULT;
         else if (strcmp(equals+1, "discard") == 0)
            option = PNG_HANDLE_CHUNK_NEVER;
         else if (strcmp(equals+1, "if-safe") == 0)
            option = PNG_HANDLE_CHUNK_IF_SAFE;
         else if (strcmp(equals+1, "save") == 0)
            option = PNG_HANDLE_CHUNK_ALWAYS;
         else
         {
            fprintf(stderr, "%s(%s): %s: unrecognized chunk option\n", d->file,
               d->test, argv[i]);
            display_exit(d);
         }

         switch (equals - argv[i])
         {
            case 4: /* chunk name */
               chunk = find(argv[i]);

               if (chunk >= 0)
               {
                  /* These #if tests have the effect of skipping the arguments
                   * if SAVE support is unavailable - we can't do a useful test
                   * in this case, so we just check the arguments!  This could
                   * be improved in the future by using the read callback.
                   */
#                 if PNG_LIBPNG_VER >= 10700 &&\
                     !defined(PNG_SAVE_UNKNOWN_CHUNKS_SUPPORTED)
                     if (option < PNG_HANDLE_CHUNK_IF_SAFE)
#                 endif /* 1.7+ SAVE_UNKNOWN_CHUNKS */
                  {
                     png_byte name[5];

                     memcpy(name, chunk_info[chunk].name, 5);
                     png_set_keep_unknown_chunks(d->png_ptr, option, name, 1);
                     chunk_info[chunk].keep = option;
                  }
                  continue;
               }

               break;

            case 7: /* default */
               if (memcmp(argv[i], "default", 7) == 0)
               {
#                 if PNG_LIBPNG_VER >= 10700 &&\
                     !defined(PNG_SAVE_UNKNOWN_CHUNKS_SUPPORTED)
                     if (option < PNG_HANDLE_CHUNK_IF_SAFE)
#                 endif /* 1.7+ SAVE_UNKNOWN_CHUNKS */
                     png_set_keep_unknown_chunks(d->png_ptr, option, NULL, 0);

                  d->keep = option;
                  continue;
               }

               break;

            case 3: /* all */
               if (memcmp(argv[i], "all", 3) == 0)
               {
#                 if PNG_LIBPNG_VER >= 10700 &&\
                     !defined(PNG_SAVE_UNKNOWN_CHUNKS_SUPPORTED)
                     if (option < PNG_HANDLE_CHUNK_IF_SAFE)
#                 endif /* 1.7+ SAVE_UNKNOWN_CHUNKS */
                     png_set_keep_unknown_chunks(d->png_ptr, option, NULL, -1);

                  d->keep = option;

                  for (chunk = 0; chunk < NINFO; ++chunk)
                     if (chunk_info[chunk].all)
                        chunk_info[chunk].keep = option;
                  continue;
               }

               break;

            default: /* some misplaced = */

               break;
         }
      }

      fprintf(stderr, "%s(%s): %s: unrecognized chunk argument\n", d->file,
         d->test, argv[i]);
      display_exit(d);
   }

   png_read_info(d->png_ptr, d->info_ptr);

   switch (png_get_interlace_type(d->png_ptr, d->info_ptr))
   {
      case PNG_INTERLACE_NONE:
         npasses = 1;
         break;

      case PNG_INTERLACE_ADAM7:
         npasses = PNG_INTERLACE_ADAM7_PASSES;
         break;

      default:
         /* Hard error because it is not test specific */
         fprintf(stderr, "%s(%s): invalid interlace type\n", d->file, d->test);
         clean_display(d);
         exit(1);
   }

   /* Skip the image data, if IDAT is not being handled then don't do this
    * because it will cause a CRC error.
    */
   if (chunk_info[0/*IDAT*/].keep == PNG_HANDLE_CHUNK_AS_DEFAULT)
   {
      png_start_read_image(d->png_ptr);
      height = png_get_image_height(d->png_ptr, d->info_ptr);

      if (npasses > 1)
      {
         png_uint_32 width = png_get_image_width(d->png_ptr, d->info_ptr);

         for (ipass=0; ipass<npasses; ++ipass)
         {
            png_uint_32 wPass = PNG_PASS_COLS(width, ipass);

            if (wPass > 0)
            {
               png_uint_32 y;

               for (y=0; y<height; ++y)
                  if (PNG_ROW_IN_INTERLACE_PASS(y, ipass))
                     png_read_row(d->png_ptr, NULL, NULL);
            }
         }
      } /* interlaced */

      else /* not interlaced */
      {
         png_uint_32 y;

         for (y=0; y<height; ++y)
            png_read_row(d->png_ptr, NULL, NULL);
      }
   }

   png_read_end(d->png_ptr, d->end_ptr);

   flags[0] = get_valid(d, d->info_ptr);
   flags[1] = get_unknown(d, d->info_ptr, 0/*before IDAT*/);

   /* Only png_read_png sets PNG_INFO_IDAT! */
   flags[chunk_info[0/*IDAT*/].keep != PNG_HANDLE_CHUNK_AS_DEFAULT] |=
      PNG_INFO_IDAT;

   flags[2] = get_valid(d, d->end_ptr);
   flags[3] = get_unknown(d, d->end_ptr, 1/*after IDAT*/);

   clean_display(d);

   return d->keep;
}